

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t * convert_run_optimize(container_t *c,uint8_t typecode_original,uint8_t *typecode_after)

{
  ulong *puVar1;
  rle16_t *prVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  run_container_t *prVar7;
  ushort uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  undefined7 in_register_00000031;
  ulong uVar12;
  int size;
  uint uVar13;
  uint uVar14;
  long lVar15;
  
  iVar6 = (int)CONCAT71(in_register_00000031,typecode_original);
  prVar7 = (run_container_t *)c;
  if (iVar6 == 1) {
    iVar6 = bitset_container_number_of_runs((bitset_container_t *)c);
    if (iVar6 * 4 + 2 < 0x2000) {
      if (iVar6 < 1) {
        __assert_fail("n_runs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x2e7d,"container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)"
                     );
      }
      prVar7 = run_container_create_given_capacity(iVar6);
      puVar1 = *(ulong **)((long)c + 8);
      uVar12 = *puVar1;
      lVar15 = 0;
      do {
        if ((uVar12 == 0) && ((int)lVar15 < 0x3ff)) {
          lVar9 = (long)(int)lVar15;
          do {
            lVar15 = lVar9 + 1;
            uVar12 = puVar1[lVar9 + 1];
            if (uVar12 != 0) break;
            bVar3 = lVar9 < 0x3fe;
            lVar9 = lVar15;
          } while (bVar3);
        }
        if (uVar12 == 0) goto LAB_0010bf00;
        lVar9 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        iVar6 = (int)lVar15;
        uVar8 = (ushort)(iVar6 << 6) | (ushort)lVar9;
        uVar12 = uVar12 - 1 | uVar12;
        if ((uVar12 == 0xffffffffffffffff) && (iVar6 < 0x3ff)) {
          lVar9 = (long)iVar6;
          do {
            lVar15 = lVar9 + 1;
            uVar12 = puVar1[lVar9 + 1];
            if (uVar12 != 0xffffffffffffffff) break;
            bVar3 = lVar9 < 0x3fe;
            lVar9 = lVar15;
          } while (bVar3);
        }
        if (uVar12 == 0xffffffffffffffff) {
          prVar2 = prVar7->runs;
          iVar6 = prVar7->n_runs;
          prVar2[iVar6].value = uVar8;
          prVar2[iVar6].length = ((short)lVar15 * 0x40 - uVar8) + 0x3f;
          prVar7->n_runs = iVar6 + 1;
LAB_0010bf00:
          bitset_container_free((bitset_container_t *)c);
          *typecode_after = '\x03';
          return prVar7;
        }
        lVar9 = 0;
        if (~uVar12 != 0) {
          for (; (~uVar12 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        prVar2 = prVar7->runs;
        iVar6 = prVar7->n_runs;
        prVar2[iVar6].value = uVar8;
        prVar2[iVar6].length = ~uVar8 + (short)((int)lVar15 << 6) + (short)lVar9;
        prVar7->n_runs = iVar6 + 1;
        uVar12 = uVar12 + 1 & uVar12;
      } while( true );
    }
    *typecode_after = '\x01';
  }
  else if (iVar6 == 2) {
    iVar6 = *c;
    lVar15 = (long)iVar6;
    if (lVar15 == 0) {
      size = 0;
    }
    else {
      lVar9 = 0;
      uVar13 = 0xfffffffe;
      size = 0;
      do {
        uVar11 = uVar13 + 1;
        uVar13 = (uint)*(ushort *)(*(long *)((long)c + 8) + lVar9);
        size = size + (uint)(uVar11 != uVar13);
        lVar9 = lVar9 + 2;
      } while (lVar15 * 2 != lVar9);
    }
    if (SBORROW4(size * 4,iVar6 * 2) == size * 4 + iVar6 * -2 < 0) {
      *typecode_after = '\x02';
    }
    else {
      prVar7 = run_container_create_given_capacity(size);
      if (iVar6 < 1) {
        __assert_fail("card > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x2e5c,"container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)"
                     );
      }
      lVar9 = *(long *)((long)c + 8);
      uVar13 = 0xffffffff;
      uVar11 = 0xfffffffe;
      lVar10 = 0;
      do {
        uVar8 = *(ushort *)(lVar9 + lVar10 * 2);
        uVar14 = (uint)uVar8;
        uVar4 = uVar14;
        uVar5 = uVar13;
        if ((uVar11 + 1 != (uint)uVar8) &&
           (uVar4 = (uint)uVar8, uVar5 = uVar14, uVar13 != 0xffffffff)) {
          prVar2 = prVar7->runs;
          iVar6 = prVar7->n_runs;
          prVar2[iVar6].value = (uint16_t)uVar13;
          prVar2[iVar6].length = (short)uVar11 - (uint16_t)uVar13;
          prVar7->n_runs = iVar6 + 1;
          uVar8 = *(ushort *)(lVar9 + lVar10 * 2);
          uVar4 = (uint)uVar8;
        }
        uVar13 = uVar5;
        uVar11 = uVar4;
        lVar10 = lVar10 + 1;
      } while (lVar15 != lVar10);
      if ((int)uVar13 < 0) {
        __assert_fail("run_start >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x2e66,"container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)"
                     );
      }
      prVar2 = prVar7->runs;
      iVar6 = prVar7->n_runs;
      prVar2[iVar6].value = (uint16_t)uVar13;
      prVar2[iVar6].length = uVar8 - (uint16_t)uVar13;
      prVar7->n_runs = iVar6 + 1;
      *typecode_after = '\x03';
      array_container_free((array_container_t *)c);
    }
  }
  else {
    if (iVar6 != 3) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x2ea6,"container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)");
    }
    prVar7 = (run_container_t *)
             convert_run_to_efficient_container((run_container_t *)c,typecode_after);
    if (prVar7 != (run_container_t *)c) {
      container_free(c,'\x03');
    }
  }
  return prVar7;
}

Assistant:

container_t *convert_run_optimize(
    container_t *c, uint8_t typecode_original,
    uint8_t *typecode_after
){
    if (typecode_original == RUN_CONTAINER_TYPE) {
        container_t *newc = convert_run_to_efficient_container(
                                    CAST_run(c), typecode_after);
        if (newc != c) {
            container_free(c, typecode_original);
        }
        return newc;
    } else if (typecode_original == ARRAY_CONTAINER_TYPE) {
        // it might need to be converted to a run container.
        array_container_t *c_qua_array = CAST_array(c);
        int32_t n_runs = array_container_number_of_runs(c_qua_array);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t card = array_container_cardinality(c_qua_array);
        int32_t size_as_array_container =
            array_container_serialized_size_in_bytes(card);

        if (size_as_run_container >= size_as_array_container) {
            *typecode_after = ARRAY_CONTAINER_TYPE;
            return c;
        }
        // else convert array to run container
        run_container_t *answer = run_container_create_given_capacity(n_runs);
        int prev = -2;
        int run_start = -1;

        assert(card > 0);
        for (int i = 0; i < card; ++i) {
            uint16_t cur_val = c_qua_array->array[i];
            if (cur_val != prev + 1) {
                // new run starts; flush old one, if any
                if (run_start != -1) add_run(answer, run_start, prev);
                run_start = cur_val;
            }
            prev = c_qua_array->array[i];
        }
        assert(run_start >= 0);
        // now prev is the last seen value
        add_run(answer, run_start, prev);
        *typecode_after = RUN_CONTAINER_TYPE;
        array_container_free(c_qua_array);
        return answer;
    } else if (typecode_original ==
               BITSET_CONTAINER_TYPE) {  // run conversions on bitset
        // does bitset need conversion to run?
        bitset_container_t *c_qua_bitset = CAST_bitset(c);
        int32_t n_runs = bitset_container_number_of_runs(c_qua_bitset);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t size_as_bitset_container =
            bitset_container_serialized_size_in_bytes();

        if (size_as_bitset_container <= size_as_run_container) {
            // no conversion needed.
            *typecode_after = BITSET_CONTAINER_TYPE;
            return c;
        }
        // bitset to runcontainer (ported from Java  RunContainer(
        // BitmapContainer bc, int nbrRuns))
        assert(n_runs > 0);  // no empty bitmaps
        run_container_t *answer = run_container_create_given_capacity(n_runs);

        int long_ctr = 0;
        uint64_t cur_word = c_qua_bitset->words[0];
        int run_count = 0;
        while (true) {
            while (cur_word == UINT64_C(0) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word = c_qua_bitset->words[++long_ctr];

            if (cur_word == UINT64_C(0)) {
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }

            int local_run_start = __builtin_ctzll(cur_word);
            int run_start = local_run_start + 64 * long_ctr;
            uint64_t cur_word_with_1s = cur_word | (cur_word - 1);

            int run_end = 0;
            while (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word_with_1s = c_qua_bitset->words[++long_ctr];

            if (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF)) {
                run_end = 64 + long_ctr * 64;  // exclusive, I guess
                add_run(answer, run_start, run_end - 1);
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }
            int local_run_end = __builtin_ctzll(~cur_word_with_1s);
            run_end = local_run_end + long_ctr * 64;
            add_run(answer, run_start, run_end - 1);
            run_count++;
            cur_word = cur_word_with_1s & (cur_word_with_1s + 1);
        }
        return answer;
    } else {
        assert(false);
        __builtin_unreachable();
        return NULL;
    }
}